

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SplitterByCenter.hpp
# Opt level: O3

void __thiscall
NBvh3::SplitterByCenter<NBvh3::KDop<16U>_>::split
          (SplitterByCenter<NBvh3::KDop<16U>_> *this,TVertices *left,TVertices *right)

{
  pointer *ppSVar1;
  SVertex *__args;
  uint uVar2;
  long lVar3;
  pointer pSVar4;
  SVertex *pSVar5;
  ulong uVar6;
  ulong uVar7;
  iterator __position;
  vector<NBvh3::SVertex,std::allocator<NBvh3::SVertex>> *this_00;
  bool bVar8;
  float fVar9;
  
  pSVar4 = (this->mVertices->super__Vector_base<NBvh3::SVertex,_std::allocator<NBvh3::SVertex>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->mVertices->super__Vector_base<NBvh3::SVertex,_std::allocator<NBvh3::SVertex>_>)._M_impl
      .super__Vector_impl_data._M_finish != pSVar4) {
    uVar6 = 0;
    uVar7 = 1;
    do {
      __args = pSVar4 + uVar6;
      uVar2 = this->mAxis;
      pSVar5 = __args;
      if (uVar2 == 0) {
LAB_001197c3:
        fVar9 = pSVar5->x;
      }
      else {
        if (uVar2 == 2) {
          pSVar5 = (SVertex *)&__args->z;
          goto LAB_001197c3;
        }
        fVar9 = 0.0;
        if (uVar2 == 1) {
          pSVar5 = (SVertex *)&__args->y;
          goto LAB_001197c3;
        }
      }
      if (fVar9 < this->mAxisValue || fVar9 == this->mAxisValue) {
        __position._M_current =
             (left->super__Vector_base<NBvh3::SVertex,_std::allocator<NBvh3::SVertex>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        this_00 = (vector<NBvh3::SVertex,std::allocator<NBvh3::SVertex>> *)left;
        if (__position._M_current ==
            (left->super__Vector_base<NBvh3::SVertex,_std::allocator<NBvh3::SVertex>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) goto LAB_00119810;
        (__position._M_current)->z = __args->z;
        fVar9 = __args->y;
        (__position._M_current)->x = __args->x;
        (__position._M_current)->y = fVar9;
        ppSVar1 = &(left->super__Vector_base<NBvh3::SVertex,_std::allocator<NBvh3::SVertex>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppSVar1 = *ppSVar1 + 1;
      }
      else {
        __position._M_current =
             (right->super__Vector_base<NBvh3::SVertex,_std::allocator<NBvh3::SVertex>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        this_00 = (vector<NBvh3::SVertex,std::allocator<NBvh3::SVertex>> *)right;
        if (__position._M_current ==
            (right->super__Vector_base<NBvh3::SVertex,_std::allocator<NBvh3::SVertex>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
LAB_00119810:
          std::vector<NBvh3::SVertex,std::allocator<NBvh3::SVertex>>::
          _M_realloc_insert<NBvh3::SVertex_const&>(this_00,__position,__args);
        }
        else {
          (__position._M_current)->z = __args->z;
          fVar9 = __args->y;
          (__position._M_current)->x = __args->x;
          (__position._M_current)->y = fVar9;
          ppSVar1 = &(right->super__Vector_base<NBvh3::SVertex,_std::allocator<NBvh3::SVertex>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppSVar1 = *ppSVar1 + 1;
        }
      }
      pSVar4 = (this->mVertices->super__Vector_base<NBvh3::SVertex,_std::allocator<NBvh3::SVertex>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar6 = ((long)(this->mVertices->
                     super__Vector_base<NBvh3::SVertex,_std::allocator<NBvh3::SVertex>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)pSVar4 >> 2) * -0x5555555555555555;
      bVar8 = uVar7 <= uVar6;
      lVar3 = uVar6 - uVar7;
      uVar6 = uVar7;
      uVar7 = (ulong)((int)uVar7 + 1);
    } while (bVar8 && lVar3 != 0);
  }
  return;
}

Assistant:

void SplitterByCenter<TBv>::split(TVertices& left, TVertices& right) const
{
    for (unsigned i = 0; i < mVertices.size(); ++i)
    {
        if (isRight(mVertices[i]))
        {
            right.push_back(mVertices[i]);
        }
        else
        {
            left.push_back(mVertices[i]);
        }
    }
}